

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddPriority.c
# Opt level: O0

DdNode * Cudd_PrioritySelect(DdManager *dd,DdNode *R,DdNode **x,DdNode **y,DdNode **z,DdNode *Pi,
                            int n,DD_PRFP Pifunc)

{
  bool bVar1;
  bool bVar2;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *n_00;
  DdNode *tmpp;
  int i;
  int createdPi;
  int createdZ;
  DdNode *Q;
  DdNode *Rxz;
  DdNode *zcube;
  DdNode *res;
  DdNode *Pi_local;
  DdNode **z_local;
  DdNode **y_local;
  DdNode **x_local;
  DdNode *R_local;
  DdManager *dd_local;
  
  zcube = (DdNode *)0x0;
  Rxz = (DdNode *)0x0;
  bVar1 = false;
  bVar2 = false;
  Pi_local = (DdNode *)z;
  res = Pi;
  if (z == (DdNode **)0x0) {
    if (Pi != (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    Pi_local = (DdNode *)malloc((long)n << 3);
    if (Pi_local == (DdNode *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
      return (DdNode *)0x0;
    }
    bVar1 = true;
    for (tmpp._4_4_ = 0; tmpp._4_4_ < n; tmpp._4_4_ = tmpp._4_4_ + 1) {
      if (0x7ffffffd < dd->size) goto LAB_00a1506d;
      pDVar3 = cuddUniqueInter(dd,dd->size,dd->one,(DdNode *)((ulong)dd->one ^ 1));
      *(DdNode **)(&Pi_local->index + (long)tmpp._4_4_ * 2) = pDVar3;
      if (*(long *)(&Pi_local->index + (long)tmpp._4_4_ * 2) == 0) goto LAB_00a1506d;
    }
  }
  if (Pi == (DdNode *)0x0) {
    res = (*Pifunc)(dd,n,x,y,(DdNode **)Pi_local);
    if (res == (DdNode *)0x0) goto LAB_00a1506d;
    bVar2 = true;
    *(int *)(((ulong)res & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)res & 0xfffffffffffffffe) + 4) + 1;
  }
  Rxz = dd->one;
  uVar4 = (ulong)Rxz & 0xfffffffffffffffe;
  *(int *)(uVar4 + 4) = *(int *)(uVar4 + 4) + 1;
  for (tmpp._4_4_ = n + -1; -1 < tmpp._4_4_; tmpp._4_4_ = tmpp._4_4_ + -1) {
    pDVar3 = Cudd_bddAnd(dd,*(DdNode **)(&Pi_local->index + (long)tmpp._4_4_ * 2),Rxz);
    if (pDVar3 == (DdNode *)0x0) goto LAB_00a1506d;
    *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
    Cudd_RecursiveDeref(dd,Rxz);
    Rxz = pDVar3;
  }
  pDVar3 = Cudd_bddSwapVariables(dd,R,y,(DdNode **)Pi_local,n);
  if (pDVar3 != (DdNode *)0x0) {
    *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4) + 1;
    n_00 = Cudd_bddAndAbstract(dd,pDVar3,res,Rxz);
    if (n_00 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar3);
    }
    else {
      *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)n_00 & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDeref(dd,pDVar3);
      zcube = Cudd_bddAnd(dd,R,(DdNode *)((ulong)n_00 ^ 1));
      if (zcube == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,n_00);
      }
      else {
        *(int *)(((ulong)zcube & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)zcube & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDeref(dd,n_00);
      }
    }
  }
LAB_00a1506d:
  if (Rxz != (DdNode *)0x0) {
    Cudd_RecursiveDeref(dd,Rxz);
  }
  if ((bVar1) && (Pi_local != (DdNode *)0x0)) {
    free(Pi_local);
  }
  if (bVar2) {
    Cudd_RecursiveDeref(dd,res);
  }
  if (zcube != (DdNode *)0x0) {
    *(int *)(((ulong)zcube & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)zcube & 0xfffffffffffffffe) + 4) + -1;
  }
  return zcube;
}

Assistant:

DdNode *
Cudd_PrioritySelect(
  DdManager * dd /* manager */,
  DdNode * R /* BDD of the relation */,
  DdNode ** x /* array of x variables */,
  DdNode ** y /* array of y variables */,
  DdNode ** z /* array of z variables (optional: may be NULL) */,
  DdNode * Pi /* BDD of the priority function (optional: may be NULL) */,
  int  n /* size of x, y, and z */,
  DD_PRFP Pifunc /* function used to build Pi if it is NULL */)
{
    DdNode *res = NULL;
    DdNode *zcube = NULL;
    DdNode *Rxz, *Q;
    int createdZ = 0;
    int createdPi = 0;
    int i;

    /* Create z variables if needed. */
    if (z == NULL) {
        if (Pi != NULL) return(NULL);
        z = ABC_ALLOC(DdNode *,n);
        if (z == NULL) {
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        createdZ = 1;
        for (i = 0; i < n; i++) {
            if (dd->size >= (int) CUDD_MAXINDEX - 1) goto endgame;
            z[i] = cuddUniqueInter(dd,dd->size,dd->one,Cudd_Not(dd->one));
            if (z[i] == NULL) goto endgame;
        }
    }

    /* Create priority function BDD if needed. */
    if (Pi == NULL) {
        Pi = Pifunc(dd,n,x,y,z);
        if (Pi == NULL) goto endgame;
        createdPi = 1;
        cuddRef(Pi);
    }

    /* Initialize abstraction cube. */
    zcube = DD_ONE(dd);
    cuddRef(zcube);
    for (i = n - 1; i >= 0; i--) {
        DdNode *tmpp;
        tmpp = Cudd_bddAnd(dd,z[i],zcube);
        if (tmpp == NULL) goto endgame;
        cuddRef(tmpp);
        Cudd_RecursiveDeref(dd,zcube);
        zcube = tmpp;
    }

    /* Compute subset of (x,y) pairs. */
    Rxz = Cudd_bddSwapVariables(dd,R,y,z,n);
    if (Rxz == NULL) goto endgame;
    cuddRef(Rxz);
    Q = Cudd_bddAndAbstract(dd,Rxz,Pi,zcube);
    if (Q == NULL) {
        Cudd_RecursiveDeref(dd,Rxz);
        goto endgame;
    }
    cuddRef(Q);
    Cudd_RecursiveDeref(dd,Rxz);
    res = Cudd_bddAnd(dd,R,Cudd_Not(Q));
    if (res == NULL) {
        Cudd_RecursiveDeref(dd,Q);
        goto endgame;
    }
    cuddRef(res);
    Cudd_RecursiveDeref(dd,Q);

endgame:
    if (zcube != NULL) Cudd_RecursiveDeref(dd,zcube);
    if (createdZ) {
        ABC_FREE(z);
    }
    if (createdPi) {
        Cudd_RecursiveDeref(dd,Pi);
    }
    if (res != NULL) cuddDeref(res);
    return(res);

}